

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

int expand_bswap(dmr_C *C,expression *expr,int cost)

{
  int iVar1;
  uint uVar2;
  expression *expr_00;
  ulong uVar3;
  longlong val;
  expression *arg;
  int cost_local;
  expression *expr_local;
  dmr_C *C_local;
  
  C_local._4_4_ = cost;
  if (cost == 0) {
    expr_00 = dmrC_first_expression((expr->field_5).field_11.args);
    uVar3 = dmrC_get_expression_value_silent(C,expr_00);
    iVar1 = (expr->ctype->field_14).field_1.normal;
    if (iVar1 == 0x10) {
      *(ulong *)&expr->field_5 = (ulong)(ushort)((ushort)uVar3 << 8 | (ushort)uVar3 >> 8);
    }
    else if (iVar1 == 0x20) {
      uVar2 = (uint)uVar3;
      *(ulong *)&expr->field_5 =
           (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    }
    else {
      if (iVar1 != 0x40) {
        return 10000;
      }
      (expr->field_5).field_0.value =
           uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    }
    *(ushort *)expr = *(ushort *)expr & 0xff00 | 1;
    (expr->field_5).field_0.taint = 0;
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

static int expand_bswap(struct dmr_C *C, struct expression *expr, int cost)
{
	struct expression *arg;
	long long val;

	if (cost)
		return cost;

	/* the arguments number & type have already been checked */
	arg = dmrC_first_expression(expr->args);
	val = dmrC_get_expression_value_silent(C, arg);
	switch (expr->ctype->bit_size) {
	case 16: expr->value = __builtin_bswap16((uint16_t)val); break;
	case 32: expr->value = __builtin_bswap32((uint32_t)val); break;
	case 64: expr->value = __builtin_bswap64(val); break;
	default: /* impossible error */
		return SIDE_EFFECTS;
	}

	expr->type = EXPR_VALUE;
	expr->taint = 0;
	return 0;
}